

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.h
# Opt level: O1

void __thiscall
jaegertracing::thrift::AggregationValidatorConcurrentClient::~AggregationValidatorConcurrentClient
          (AggregationValidatorConcurrentClient *this,void **vtt)

{
  void *pvVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  pcVar2 = (this->sync_).fnamePending_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->sync_).fnamePending_.field_2) {
    operator_delete(pcVar2);
  }
  (this->sync_).readMutex_._vptr_Mutex = (_func_int **)&PTR__Mutex_0026bdb0;
  p_Var3 = (this->sync_).readMutex_.impl_.
           super___shared_ptr<apache::thrift::concurrency::Mutex::impl,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  (this->sync_).writeMutex_._vptr_Mutex = (_func_int **)&PTR__Mutex_0026bdb0;
  p_Var3 = (this->sync_).writeMutex_.impl_.
           super___shared_ptr<apache::thrift::concurrency::Mutex::impl,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::
  vector<std::shared_ptr<apache::thrift::concurrency::Monitor>,_std::allocator<std::shared_ptr<apache::thrift::concurrency::Monitor>_>_>
  ::~vector(&(this->sync_).freeMonitors_);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<apache::thrift::concurrency::Monitor>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<apache::thrift::concurrency::Monitor>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<apache::thrift::concurrency::Monitor>_>_>_>
  ::~_Rb_tree(&(this->sync_).seqidToMonitorMap_._M_t);
  (this->sync_).seqidMutex_._vptr_Mutex = (_func_int **)&PTR__Mutex_0026bdb0;
  p_Var3 = (this->sync_).seqidMutex_.impl_.
           super___shared_ptr<apache::thrift::concurrency::Mutex::impl,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->poprot_).
           super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->piprot_).
           super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    return;
  }
  return;
}

Assistant:

AggregationValidatorConcurrentClient(apache::thrift::stdcxx::shared_ptr< ::apache::thrift::protocol::TProtocol> prot) {
    setProtocol(prot);
  }